

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O1

void __thiscall
slang::ast::ConcurrentAssertionStatement::serializeTo
          (ConcurrentAssertionStatement *this,ASTSerializer *serializer)

{
  size_t __n;
  
  ASTSerializer::write(serializer,0xc,"propertySpec",(size_t)this->propertySpec);
  if (this->ifTrue != (Statement *)0x0) {
    ASTSerializer::write(serializer,6,"ifTrue",(size_t)this->ifTrue);
  }
  if (this->ifFalse != (Statement *)0x0) {
    ASTSerializer::write(serializer,7,"ifFalse",(size_t)this->ifFalse);
  }
  __n = strlen(*(char **)(toString(slang::ast::AssertionKind)::strings +
                         (long)(int)this->assertionKind * 8));
  ASTSerializer::write(serializer,0xd,"assertionKind",__n);
  return;
}

Assistant:

void ConcurrentAssertionStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.write("propertySpec", propertySpec);
    if (ifTrue)
        serializer.write("ifTrue", *ifTrue);
    if (ifFalse)
        serializer.write("ifFalse", *ifFalse);
    serializer.write("assertionKind", toString(assertionKind));
}